

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

int exegen(voccxdef *ctx,objnum obj,prpnum genprop,prpnum verprop,prpnum actprop)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined6 in_register_00000032;
  objnum genobj;
  objnum actobj;
  objnum verobj;
  
  if ((int)CONCAT62(in_register_00000032,obj) == 0xffff) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    uVar1 = objgetap(ctx->voccxmem,obj,genprop,&genobj,0);
    if (uVar1 != 0) {
      uVar1 = objgetap(ctx->voccxmem,obj,verprop,&verobj,0);
      uVar2 = objgetap(ctx->voccxmem,obj,actprop,&actobj,0);
      if ((uVar1 != 0) &&
         (iVar3 = bifinh(ctx,ctx->voccxinh[genobj >> 8][(byte)genobj],verobj), iVar3 == 0)) {
        return 0;
      }
      if ((uVar2 != 0) &&
         (iVar3 = bifinh(ctx,ctx->voccxinh[genobj >> 8][(byte)genobj],actobj), iVar3 == 0)) {
        return 0;
      }
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int exegen(voccxdef *ctx, objnum obj, prpnum genprop,
                  prpnum verprop, prpnum actprop)
{
    int     hasgen;                                 /* has xobjGen property */
    objnum  genobj;                         /* object with xobjGen property */
    int     hasver;                               /* has verXoVerb property */
    objnum  verobj;                       /* object with verXoVerb property */
    int     hasact;                                  /* has xoVerb property */
    objnum  actobj;                          /* object with xoVerb property */
    
    /* ignore it if there's no object here */
    if (obj == MCMONINV) return(FALSE);

    /* look up the xobjGen property, and ignore if not present */
    hasgen = objgetap(ctx->voccxmem, obj, genprop, &genobj, FALSE);
    if (!hasgen) return(FALSE);

    /* look up the verXoVerb and xoVerb properties */
    hasver = objgetap(ctx->voccxmem, obj, verprop, &verobj, FALSE);
    hasact = objgetap(ctx->voccxmem, obj, actprop, &actobj, FALSE);

    /* ignore if verXoVerb or xoVerb "overrides" xobjGen */
    if ((hasver && !bifinh(ctx, vocinh(ctx, genobj), verobj))
        || (hasact && !bifinh(ctx, vocinh(ctx, genobj), actobj)))
        return FALSE;
    
    /* all conditions are met - execute dobjGen */
    return TRUE;
}